

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O1

hpdata_t * duckdb_je_hpdata_age_heap_remove_first(hpdata_age_heap_t *ph)

{
  long lVar1;
  long lVar2;
  hpdata_t *phVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  long lVar11;
  void *pvVar12;
  
  pvVar7 = (ph->ph).root;
  if (pvVar7 == (void *)0x0) {
    return (hpdata_t *)0x0;
  }
  (ph->ph).auxcount = 0;
  lVar6 = *(long *)((long)pvVar7 + 0x30);
  if (lVar6 != 0) {
    *(undefined8 *)((long)pvVar7 + 0x28) = 0;
    *(undefined8 *)((long)pvVar7 + 0x30) = 0;
    *(undefined8 *)(lVar6 + 0x28) = 0;
    lVar9 = *(long *)(lVar6 + 0x30);
    if (lVar9 != 0) {
      lVar11 = *(long *)(lVar9 + 0x30);
      if (lVar11 != 0) {
        *(undefined8 *)(lVar11 + 0x28) = 0;
      }
      *(undefined8 *)(lVar6 + 0x28) = 0;
      *(undefined8 *)(lVar6 + 0x30) = 0;
      *(undefined8 *)(lVar9 + 0x28) = 0;
      *(undefined8 *)(lVar9 + 0x30) = 0;
      if (*(ulong *)(lVar6 + 8) < *(ulong *)(lVar9 + 8)) {
        *(long *)(lVar9 + 0x28) = lVar6;
        lVar5 = *(long *)(lVar6 + 0x38);
        *(long *)(lVar9 + 0x30) = lVar5;
        if (lVar5 != 0) {
          *(long *)(lVar5 + 0x28) = lVar9;
        }
        *(long *)(lVar6 + 0x38) = lVar9;
        lVar9 = lVar6;
        lVar5 = lVar6;
      }
      else {
        *(long *)(lVar6 + 0x28) = lVar9;
        lVar5 = *(long *)(lVar9 + 0x38);
        *(long *)(lVar6 + 0x30) = lVar5;
        if (lVar5 != 0) {
          *(long *)(lVar5 + 0x28) = lVar6;
        }
        *(long *)(lVar9 + 0x38) = lVar6;
        lVar5 = lVar9;
      }
      while (lVar6 = lVar11, lVar6 != 0) {
        lVar1 = *(long *)(lVar6 + 0x30);
        if (lVar1 == 0) {
          lVar11 = 0;
        }
        else {
          lVar11 = *(long *)(lVar1 + 0x30);
          if (lVar11 != 0) {
            *(undefined8 *)(lVar11 + 0x28) = 0;
          }
          *(undefined8 *)(lVar6 + 0x28) = 0;
          *(undefined8 *)(lVar6 + 0x30) = 0;
          *(undefined8 *)(lVar1 + 0x28) = 0;
          *(undefined8 *)(lVar1 + 0x30) = 0;
          if (*(ulong *)(lVar6 + 8) < *(ulong *)(lVar1 + 8)) {
            *(long *)(lVar1 + 0x28) = lVar6;
            lVar2 = *(long *)(lVar6 + 0x38);
            *(long *)(lVar1 + 0x30) = lVar2;
            if (lVar2 != 0) {
              *(long *)(lVar2 + 0x28) = lVar1;
            }
            *(long *)(lVar6 + 0x38) = lVar1;
          }
          else {
            *(long *)(lVar6 + 0x28) = lVar1;
            lVar2 = *(long *)(lVar1 + 0x38);
            *(long *)(lVar6 + 0x30) = lVar2;
            if (lVar2 != 0) {
              *(long *)(lVar2 + 0x28) = lVar6;
            }
            *(long *)(lVar1 + 0x38) = lVar6;
            lVar6 = lVar1;
          }
        }
        *(long *)(lVar9 + 0x30) = lVar6;
        lVar9 = lVar6;
      }
      lVar11 = *(long *)(lVar5 + 0x30);
      lVar6 = lVar5;
      if (lVar11 != 0) {
        while( true ) {
          lVar1 = *(long *)(lVar11 + 0x30);
          *(undefined8 *)(lVar5 + 0x30) = 0;
          *(undefined8 *)(lVar11 + 0x30) = 0;
          lVar6 = lVar5;
          if (lVar11 != 0) {
            if (*(ulong *)(lVar5 + 8) < *(ulong *)(lVar11 + 8)) {
              *(long *)(lVar11 + 0x28) = lVar5;
              lVar2 = *(long *)(lVar5 + 0x38);
              *(long *)(lVar11 + 0x30) = lVar2;
              if (lVar2 != 0) {
                *(long *)(lVar2 + 0x28) = lVar11;
              }
              *(long *)(lVar5 + 0x38) = lVar11;
            }
            else {
              *(long *)(lVar5 + 0x28) = lVar11;
              lVar6 = *(long *)(lVar11 + 0x38);
              *(long *)(lVar5 + 0x30) = lVar6;
              if (lVar6 != 0) {
                *(long *)(lVar6 + 0x28) = lVar5;
              }
              *(long *)(lVar11 + 0x38) = lVar5;
              lVar6 = lVar11;
            }
          }
          if (lVar1 == 0) break;
          *(long *)(lVar9 + 0x30) = lVar6;
          lVar11 = *(long *)(lVar1 + 0x30);
          lVar5 = lVar1;
          lVar9 = lVar6;
        }
      }
    }
    *(void **)(lVar6 + 0x28) = pvVar7;
    lVar9 = *(long *)((long)pvVar7 + 0x38);
    *(long *)(lVar6 + 0x30) = lVar9;
    if (lVar9 != 0) {
      *(long *)(lVar9 + 0x28) = lVar6;
    }
    *(long *)((long)pvVar7 + 0x38) = lVar6;
  }
  phVar3 = (hpdata_t *)(ph->ph).root;
  pvVar7 = (phVar3->field_13).age_link.link.lchild;
  if (pvVar7 == (void *)0x0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar10 = *(void **)((long)pvVar7 + 0x30);
    if (pvVar10 != (void *)0x0) {
      pvVar12 = *(void **)((long)pvVar10 + 0x30);
      if (pvVar12 != (void *)0x0) {
        *(undefined8 *)((long)pvVar12 + 0x28) = 0;
      }
      *(undefined8 *)((long)pvVar7 + 0x28) = 0;
      *(undefined8 *)((long)pvVar7 + 0x30) = 0;
      *(undefined8 *)((long)pvVar10 + 0x28) = 0;
      *(undefined8 *)((long)pvVar10 + 0x30) = 0;
      if (*(ulong *)((long)pvVar7 + 8) < *(ulong *)((long)pvVar10 + 8)) {
        *(void **)((long)pvVar10 + 0x28) = pvVar7;
        lVar6 = *(long *)((long)pvVar7 + 0x38);
        *(long *)((long)pvVar10 + 0x30) = lVar6;
        if (lVar6 != 0) {
          *(void **)(lVar6 + 0x28) = pvVar10;
        }
        *(void **)((long)pvVar7 + 0x38) = pvVar10;
        pvVar10 = pvVar7;
        pvVar8 = pvVar7;
      }
      else {
        *(void **)((long)pvVar7 + 0x28) = pvVar10;
        lVar6 = *(long *)((long)pvVar10 + 0x38);
        *(long *)((long)pvVar7 + 0x30) = lVar6;
        if (lVar6 != 0) {
          *(void **)(lVar6 + 0x28) = pvVar7;
        }
        *(void **)((long)pvVar10 + 0x38) = pvVar7;
        pvVar8 = pvVar10;
      }
      while (pvVar7 = pvVar12, pvVar7 != (void *)0x0) {
        pvVar4 = *(void **)((long)pvVar7 + 0x30);
        if (pvVar4 == (void *)0x0) {
          pvVar12 = (void *)0x0;
        }
        else {
          pvVar12 = *(void **)((long)pvVar4 + 0x30);
          if (pvVar12 != (void *)0x0) {
            *(undefined8 *)((long)pvVar12 + 0x28) = 0;
          }
          *(undefined8 *)((long)pvVar7 + 0x28) = 0;
          *(undefined8 *)((long)pvVar7 + 0x30) = 0;
          *(undefined8 *)((long)pvVar4 + 0x28) = 0;
          *(undefined8 *)((long)pvVar4 + 0x30) = 0;
          if (*(ulong *)((long)pvVar7 + 8) < *(ulong *)((long)pvVar4 + 8)) {
            *(void **)((long)pvVar4 + 0x28) = pvVar7;
            lVar6 = *(long *)((long)pvVar7 + 0x38);
            *(long *)((long)pvVar4 + 0x30) = lVar6;
            if (lVar6 != 0) {
              *(void **)(lVar6 + 0x28) = pvVar4;
            }
            *(void **)((long)pvVar7 + 0x38) = pvVar4;
          }
          else {
            *(void **)((long)pvVar7 + 0x28) = pvVar4;
            lVar6 = *(long *)((long)pvVar4 + 0x38);
            *(long *)((long)pvVar7 + 0x30) = lVar6;
            if (lVar6 != 0) {
              *(void **)(lVar6 + 0x28) = pvVar7;
            }
            *(void **)((long)pvVar4 + 0x38) = pvVar7;
            pvVar7 = pvVar4;
          }
        }
        *(void **)((long)pvVar10 + 0x30) = pvVar7;
        pvVar10 = pvVar7;
      }
      pvVar12 = *(void **)((long)pvVar8 + 0x30);
      pvVar7 = pvVar8;
      if (pvVar12 != (void *)0x0) {
        while( true ) {
          pvVar4 = *(void **)((long)pvVar12 + 0x30);
          *(undefined8 *)((long)pvVar8 + 0x30) = 0;
          *(undefined8 *)((long)pvVar12 + 0x30) = 0;
          pvVar7 = pvVar8;
          if (pvVar12 != (void *)0x0) {
            if (*(ulong *)((long)pvVar8 + 8) < *(ulong *)((long)pvVar12 + 8)) {
              *(void **)((long)pvVar12 + 0x28) = pvVar8;
              lVar6 = *(long *)((long)pvVar8 + 0x38);
              *(long *)((long)pvVar12 + 0x30) = lVar6;
              if (lVar6 != 0) {
                *(void **)(lVar6 + 0x28) = pvVar12;
              }
              *(void **)((long)pvVar8 + 0x38) = pvVar12;
            }
            else {
              *(void **)((long)pvVar8 + 0x28) = pvVar12;
              lVar6 = *(long *)((long)pvVar12 + 0x38);
              *(long *)((long)pvVar8 + 0x30) = lVar6;
              if (lVar6 != 0) {
                *(void **)(lVar6 + 0x28) = pvVar8;
              }
              *(void **)((long)pvVar12 + 0x38) = pvVar8;
              pvVar7 = pvVar12;
            }
          }
          if (pvVar4 == (void *)0x0) break;
          *(void **)((long)pvVar10 + 0x30) = pvVar7;
          pvVar12 = *(void **)((long)pvVar4 + 0x30);
          pvVar8 = pvVar4;
          pvVar10 = pvVar7;
        }
      }
    }
  }
  (ph->ph).root = pvVar7;
  return phVar3;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void *
ph_remove_first(ph_t *ph, size_t offset, ph_cmp_t cmp) {
	void *ret;

	if (ph->root == NULL) {
		return NULL;
	}
	ph_merge_aux(ph, offset, cmp);
	ret = ph->root;
	ph->root = ph_merge_children(ph->root, offset, cmp);

	return ret;

}